

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

View<int,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::operator=
          (View<int,_false,_std::allocator<unsigned_long>_> *this,int *value)

{
  int iVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  size_t sVar5;
  reference piVar6;
  runtime_error *this_00;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  iterator it;
  Iterator<int,_false,_std::allocator<unsigned_long>_> IStack_58;
  
  if (this->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_00111f8d:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  testInvariant(this);
  auVar3 = _DAT_00128050;
  if ((this->geometry_).isSimple_ == true) {
    sVar5 = (this->geometry_).size_;
    if (sVar5 == 0) {
      return this;
    }
    piVar2 = this->data_;
    iVar1 = *value;
    lVar7 = sVar5 - 1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar10 = auVar10 ^ _DAT_00128050;
    auVar12 = _DAT_00128030;
    auVar13 = _DAT_00128040;
    do {
      auVar14 = auVar13 ^ auVar3;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar11 && auVar10._0_4_ < auVar14._0_4_ ||
                  iVar11 < auVar14._4_4_) & 1)) {
        piVar2[uVar8] = iVar1;
      }
      if ((auVar14._12_4_ != auVar10._12_4_ || auVar14._8_4_ <= auVar10._8_4_) &&
          auVar14._12_4_ <= auVar10._12_4_) {
        piVar2[uVar8 + 1] = iVar1;
      }
      auVar14 = auVar12 ^ auVar3;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar11 && (iVar15 != iVar11 || auVar14._0_4_ <= auVar10._0_4_)) {
        piVar2[uVar8 + 2] = iVar1;
        piVar2[uVar8 + 3] = iVar1;
      }
      uVar8 = uVar8 + 4;
      lVar7 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar7 + 4;
      lVar7 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar7 + 4;
    } while ((sVar5 + 3 & 0xfffffffffffffffc) != uVar8);
    return this;
  }
  piVar9 = this->data_;
  if (piVar9 == (int *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_00111f8d;
  }
  switch((this->geometry_).dimension_) {
  case 1:
    sVar5 = shape(this,0);
    if (sVar5 != 0) {
      uVar8 = 0;
      do {
        *piVar9 = *value;
        sVar5 = strides(this,0);
        piVar9 = piVar9 + sVar5;
        uVar8 = uVar8 + 1;
        sVar5 = shape(this,0);
      } while (uVar8 < sVar5);
    }
    shape(this,0);
    sVar5 = 0;
    goto LAB_00111e22;
  case 2:
    marray_detail::
    OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
    ::operate(this,value,piVar9);
    break;
  case 3:
    sVar5 = shape(this,2);
    if (sVar5 != 0) {
      uVar8 = 0;
      do {
        marray_detail::
        OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(this,value,piVar9);
        sVar5 = strides(this,2);
        piVar9 = piVar9 + sVar5;
        uVar8 = uVar8 + 1;
        sVar5 = shape(this,2);
      } while (uVar8 < sVar5);
    }
    shape(this,2);
    sVar5 = 2;
LAB_00111e22:
    strides(this,sVar5);
    break;
  case 4:
    marray_detail::
    OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
    ::operate(this,value,piVar9);
    break;
  case 5:
    marray_detail::
    OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
    ::operate(this,value,piVar9);
    break;
  default:
    sVar5 = dimension(this);
    if (sVar5 == 6) {
      marray_detail::
      OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
      ::operate(this,value,this->data_);
    }
    else {
      sVar5 = dimension(this);
      if (sVar5 == 7) {
        marray_detail::
        OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(this,value,this->data_);
      }
      else {
        sVar5 = dimension(this);
        if (sVar5 == 8) {
          marray_detail::
          OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
          ::operate(this,value,this->data_);
        }
        else {
          sVar5 = dimension(this);
          if (sVar5 == 9) {
            marray_detail::
            OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
            ::operate(this,value,this->data_);
          }
          else {
            sVar5 = dimension(this);
            if (sVar5 == 10) {
              marray_detail::
              OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
              ::operate(this,value,this->data_);
            }
            else {
              testInvariant(this);
              Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&IStack_58,this,0);
              while (bVar4 = Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore
                                       (&IStack_58), bVar4) {
                iVar1 = *value;
                piVar6 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&IStack_58)
                ;
                *piVar6 = iVar1;
                Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&IStack_58);
              }
              if (IStack_58.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(IStack_58.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)IStack_58.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)IStack_58.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

inline View<T, isConst, A>& 
View<T, isConst, A>::operator=
(
    const T& value
)
{
    marray_detail::Assert(MARRAY_NO_DEBUG || data_ != 0);
    if(isSimple()) {
        for(std::size_t j=0; j<geometry_.size(); ++j) {
            data_[j] = value;
        }
    }
    else if(dimension() == 1)
        marray_detail::OperateHelperBinaryScalar<1, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 2)
        marray_detail::OperateHelperBinaryScalar<2, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 3)
        marray_detail::OperateHelperBinaryScalar<3, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 4)
        marray_detail::OperateHelperBinaryScalar<4, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 5)
        marray_detail::OperateHelperBinaryScalar<5, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 6)
        marray_detail::OperateHelperBinaryScalar<6, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 7)
        marray_detail::OperateHelperBinaryScalar<7, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 8)
        marray_detail::OperateHelperBinaryScalar<8, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 9)
        marray_detail::OperateHelperBinaryScalar<9, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 10)
        marray_detail::OperateHelperBinaryScalar<10, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else {
        for(iterator it = begin(); it.hasMore(); ++it) {
            *it = value;
        }
    }
    return *this;
}